

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O2

int nn_sendmsg(int s,nn_msghdr *msghdr,int flags)

{
  nn_chunkref *self;
  int iVar1;
  nn_iovec *pnVar2;
  nn_sock *self_00;
  int iVar3;
  void *pvVar4;
  nn_cmsghdr *cmsg;
  int *piVar5;
  ulong uVar6;
  size_t size;
  long lVar7;
  bool bVar8;
  size_t sStack_b0;
  nn_sock *sock;
  nn_msg msg;
  
  iVar3 = nn_global_hold_socket(&sock,s);
  if (-1 < iVar3) {
    iVar3 = -0x16;
    if (msghdr != (nn_msghdr *)0x0) {
      iVar1 = msghdr->msg_iovlen;
      if ((long)iVar1 < 0) {
        iVar3 = -0x5a;
      }
      else {
        if ((iVar1 != 1) || (msghdr->msg_iov->iov_len != 0xffffffffffffffff)) {
          size = 0;
          lVar7 = 0;
LAB_0012031c:
          if ((long)iVar1 * 0x10 + 0x10 == lVar7 + 0x10) {
            nn_msg_init(&msg,size);
            lVar7 = 8;
            sStack_b0 = 0;
            for (uVar6 = 0; uVar6 != (uint)msghdr->msg_iovlen; uVar6 = uVar6 + 1) {
              pnVar2 = msghdr->msg_iov;
              pvVar4 = nn_chunkref_data(&msg.body);
              memcpy((void *)((long)pvVar4 + sStack_b0),*(void **)((long)pnVar2 + lVar7 + -8),
                     *(size_t *)((long)&pnVar2->iov_base + lVar7));
              sStack_b0 = sStack_b0 + *(long *)((long)&pnVar2->iov_base + lVar7);
              lVar7 = lVar7 + 0x10;
            }
            bVar8 = true;
            goto LAB_001203a1;
          }
          uVar6 = *(ulong *)((long)&msghdr->msg_iov->iov_len + lVar7);
          if (uVar6 != 0xffffffffffffffff) {
            if ((uVar6 == 0) || (*(long *)((long)&msghdr->msg_iov->iov_base + lVar7) != 0))
            goto LAB_00120347;
            iVar3 = -0xe;
          }
          goto LAB_001204ff;
        }
        pvVar4 = *msghdr->msg_iov->iov_base;
        if (pvVar4 == (void *)0x0) {
          iVar3 = -0xe;
        }
        else {
          sStack_b0 = nn_chunk_size(pvVar4);
          nn_msg_init_chunk(&msg,pvVar4);
          bVar8 = false;
LAB_001203a1:
          if ((undefined8 *)msghdr->msg_control != (undefined8 *)0x0) {
            if (msghdr->msg_controllen == 0xffffffffffffffff) {
              pvVar4 = *msghdr->msg_control;
              nn_chunkref_term(&msg.hdrs);
              nn_chunkref_init_chunk(&msg.hdrs,pvVar4);
            }
            else {
              self = &msg.hdrs;
              nn_chunkref_term(self);
              nn_chunkref_init(self,msghdr->msg_controllen);
              pvVar4 = nn_chunkref_data(self);
              memcpy(pvVar4,msghdr->msg_control,msghdr->msg_controllen);
            }
            cmsg = (nn_cmsghdr *)0x0;
            do {
              cmsg = nn_cmsg_nxthdr_(msghdr,cmsg);
              if (cmsg == (nn_cmsghdr *)0x0) goto LAB_0012047b;
            } while ((cmsg->cmsg_level != 1) || (cmsg->cmsg_type != 1));
            if ((cmsg->cmsg_len - 0x19 < 0xfffffffffffffff7) &&
               (uVar6 = cmsg[1].cmsg_len, uVar6 <= cmsg->cmsg_len - 0x18)) {
              nn_chunkref_term(&msg.sphdr);
              nn_chunkref_init(&msg.sphdr,uVar6);
              pvVar4 = nn_chunkref_data(&msg.sphdr);
              memcpy(pvVar4,&cmsg[1].cmsg_level,uVar6);
            }
          }
LAB_0012047b:
          self_00 = sock;
          iVar3 = nn_sock_send(sock,&msg,flags);
          if (-1 < iVar3) {
            nn_sock_stat_increment(self_00,0x12d,1);
            nn_sock_stat_increment(self_00,0x12f,sStack_b0);
            nn_global_rele_socket(self_00);
            goto LAB_001204c1;
          }
          if (!bVar8) {
            nn_chunkref_init(&msg.body,0);
          }
          nn_msg_term(&msg);
        }
      }
    }
LAB_001204ff:
    nn_global_rele_socket(sock);
  }
  piVar5 = __errno_location();
  *piVar5 = -iVar3;
  sStack_b0 = 0xffffffffffffffff;
LAB_001204c1:
  return (int)sStack_b0;
LAB_00120347:
  bVar8 = CARRY8(size,uVar6);
  size = size + uVar6;
  lVar7 = lVar7 + 0x10;
  if (bVar8) goto LAB_001204ff;
  goto LAB_0012031c;
}

Assistant:

int nn_sendmsg (int s, const struct nn_msghdr *msghdr, int flags)
{
    int rc;
    size_t sz;
    size_t spsz;
    int i;
    struct nn_iovec *iov;
    struct nn_msg msg;
    void *chunk;
    int nnmsg;
    struct nn_cmsghdr *cmsg;
    struct nn_sock *sock;

    rc = nn_global_hold_socket (&sock, s);
    if (nn_slow (rc < 0)) {
        errno = -rc;
        return -1;
    }

    if (nn_slow (!msghdr)) {
        rc = -EINVAL;
        goto fail;
    }

    if (nn_slow (msghdr->msg_iovlen < 0)) {
        rc = -EMSGSIZE;
        goto fail;
    }

    if (msghdr->msg_iovlen == 1 && msghdr->msg_iov [0].iov_len == NN_MSG) {
        chunk = *(void**) msghdr->msg_iov [0].iov_base;
        if (nn_slow (chunk == NULL)) {
            rc = -EFAULT;
            goto fail;
        }
        sz = nn_chunk_size (chunk);
        nn_msg_init_chunk (&msg, chunk);
        nnmsg = 1;
    }
    else {

        /*  Compute the total size of the message. */
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            if (nn_slow (iov->iov_len == NN_MSG)) {
               rc = -EINVAL;
               goto fail;
            }
            if (nn_slow (!iov->iov_base && iov->iov_len)) {
                rc = -EFAULT;
                goto fail;
            }
            if (nn_slow (sz + iov->iov_len < sz)) {
                rc = -EINVAL;
                goto fail;
            }
            sz += iov->iov_len;
        }

        /*  Create a message object from the supplied scatter array. */
        nn_msg_init (&msg, sz);
        sz = 0;
        for (i = 0; i != msghdr->msg_iovlen; ++i) {
            iov = &msghdr->msg_iov [i];
            memcpy (((uint8_t*) nn_chunkref_data (&msg.body)) + sz,
                iov->iov_base, iov->iov_len);
            sz += iov->iov_len;
        }

        nnmsg = 0;
    }

    /*  Add ancillary data to the message. */
    if (msghdr->msg_control) {

        /*  Copy all headers. */
        /*  TODO: SP_HDR should not be copied here! */
        if (msghdr->msg_controllen == NN_MSG) {
            chunk = *((void**) msghdr->msg_control);
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init_chunk (&msg.hdrs, chunk);
        }
        else {
            nn_chunkref_term (&msg.hdrs);
            nn_chunkref_init (&msg.hdrs, msghdr->msg_controllen);
            memcpy (nn_chunkref_data (&msg.hdrs),
                msghdr->msg_control, msghdr->msg_controllen);
        }

        /* Search for SP_HDR property. */
        cmsg = NN_CMSG_FIRSTHDR (msghdr);
        while (cmsg) {
            if (cmsg->cmsg_level == PROTO_SP && cmsg->cmsg_type == SP_HDR) {
                unsigned char *ptr = NN_CMSG_DATA (cmsg);
                size_t clen = cmsg->cmsg_len - NN_CMSG_SPACE (0);
                if (clen > sizeof (size_t)) {
                    spsz = *(size_t *)(void *)ptr;
                    if (spsz <= (clen - sizeof (size_t))) {
                        /*  Copy body of SP_HDR property into 'sphdr'. */
                        nn_chunkref_term (&msg.sphdr);
                        nn_chunkref_init (&msg.sphdr, spsz);
                         memcpy (nn_chunkref_data (&msg.sphdr),
                             ptr + sizeof (size_t), spsz);
                    }
                }
                break;
            }
            cmsg = NN_CMSG_NXTHDR (msghdr, cmsg);
        }
    }

    /*  Send it further down the stack. */
    rc = nn_sock_send (sock, &msg, flags);
    if (nn_slow (rc < 0)) {

        /*  If we are dealing with user-supplied buffer, detach it from
            the message object. */
        if (nnmsg)
            nn_chunkref_init (&msg.body, 0);

        nn_msg_term (&msg);
        goto fail;
    }

    /*  Adjust the statistics. */
    nn_sock_stat_increment (sock, NN_STAT_MESSAGES_SENT, 1);
    nn_sock_stat_increment (sock, NN_STAT_BYTES_SENT, sz);

    nn_global_rele_socket (sock);

    return (int) sz;

fail:
    nn_global_rele_socket (sock);

    errno = -rc;
    return -1;
}